

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Boxed_Number::const_binary_go<unsigned_long>
          (Boxed_Number *this,Opers t_oper,unsigned_long *t,unsigned_long *u)

{
  bad_any_cast *this_00;
  Boxed_Value BVar1;
  
  switch(t_oper) {
  case sum:
    break;
  case quotient:
    check_divide_by_zero<unsigned_long>(*u,(type *)0x0);
    break;
  case product:
    break;
  case difference:
    break;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  BVar1 = detail::const_var_impl<unsigned_long>((unsigned_long *)this);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value const_binary_go(Operators::Opers t_oper, const T &t, const T &u) 
      {
        switch (t_oper)
        {
          case Operators::sum:
            return const_var(t + u);
          case Operators::quotient:
            check_divide_by_zero(u);
            return const_var(t / u);
          case Operators::product:
            return const_var(t * u);
          case Operators::difference:
            return const_var(t - u);
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
      }